

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>::Data
          (Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *this,
          Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *other)

{
  long lVar1;
  bool bVar2;
  long in_RSI;
  Span<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *in_RDI;
  long in_FS_OFFSET;
  R RVar3;
  Node<unsigned_long_long,_QSslServerPrivate::SocketData> *newNode;
  Node<unsigned_long_long,_QSslServerPrivate::SocketData> *n;
  size_t index;
  Span *span;
  size_t s;
  R r;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff80;
  Span<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *this_00;
  ulong local_58;
  ulong local_48;
  size_t in_stack_ffffffffffffffc0;
  Span *local_28;
  size_t local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff80,(int)((ulong)in_RDI >> 0x20));
  (((SocketData *)((long)in_RDI->offsets + 8))->readyReadConnection).d_ptr = *(void **)(in_RSI + 8);
  ((Connection *)((long)in_RDI->offsets + 0x10))->d_ptr = *(void **)(in_RSI + 0x10);
  (((shared_ptr<QTimer> *)((long)in_RDI->offsets + 0x18))->
  super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = *(element_type **)(in_RSI + 0x18)
  ;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)in_RDI->offsets + 0x20))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  RVar3 = allocateSpans(in_stack_ffffffffffffffc0);
  local_28 = RVar3.spans;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)in_RDI->offsets + 0x20))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28;
  local_20 = RVar3.nSpans;
  this_00 = in_RDI;
  for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
    lVar1 = *(long *)(in_RSI + 0x20);
    for (local_58 = 0; local_58 < 0x80; local_58 = local_58 + 1) {
      bVar2 = Span<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>::hasNode
                        ((Span<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>
                          *)(lVar1 + local_48 * 0x90),local_58);
      if (bVar2) {
        Span<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>::at
                  (this_00,(size_t)in_RDI);
        local_18.span = (Span *)0xaaaaaaaaaaaaaaaa;
        local_18.index = 0xaaaaaaaaaaaaaaaa;
        Bucket::Bucket(&local_18,(Span *)(*(long *)(this_00->offsets + 0x20) + local_48 * 0x90),
                       local_58);
        Bucket::insert((Bucket *)0x3b821b);
        Node<unsigned_long_long,_QSslServerPrivate::SocketData>::Node
                  ((Node<unsigned_long_long,_QSslServerPrivate::SocketData> *)this_00,
                   (Node<unsigned_long_long,_QSslServerPrivate::SocketData> *)in_RDI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }